

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingScheme.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::EncodingScheme::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EncodingScheme *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Encoding Scheme:",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tClass:    ",0xc);
  ENUMS::GetEnumAsStringEncodingClass_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((this->m_EncodingSchemeUnion).m_ui16EncodingScheme >> 0xe),
             Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tType:     ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tTDL:      ",0xc);
  ENUMS::GetEnumAsStringTDLType_abi_cxx11_(&local_1e0,(ENUMS *)(ulong)this->m_ui16TDLType,Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString EncodingScheme::GetAsString() const
{
    KStringStream ss;

    ss << "Encoding Scheme:"
       << "\n\tClass:    " << GetEnumAsStringEncodingClass( m_EncodingSchemeUnion.m_ui16Class )
       << "\n\tType:     " << m_EncodingSchemeUnion.m_ui16Type
       << "\n\tTDL:      " << GetEnumAsStringTDLType( m_ui16TDLType )
       << "\n";

    return ss.str();
}